

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SoftHSM.cpp
# Opt level: O3

CK_RV __thiscall
SoftHSM::generateGeneric
          (SoftHSM *this,CK_SESSION_HANDLE hSession,CK_ATTRIBUTE_PTR pTemplate,CK_ULONG ulCount,
          CK_OBJECT_HANDLE_PTR phKey,CK_BBOOL isOnToken,CK_BBOOL isPrivate)

{
  ulong uVar1;
  void *pvVar2;
  SoftHSM *pSVar3;
  char cVar4;
  byte bVar5;
  int iVar6;
  Session *this_00;
  unsigned_long *puVar7;
  CryptoFactory *pCVar8;
  undefined4 extraout_var;
  ulong uVar9;
  long *plVar10;
  ByteString *pBVar11;
  CK_ULONG CVar12;
  CK_ULONG ulCount_00;
  CK_SESSION_HANDLE CVar13;
  undefined8 uVar14;
  char *format;
  ulong inBitLen;
  CK_OBJECT_HANDLE *pCVar15;
  CK_RV CVar16;
  bool bVar17;
  CK_KEY_TYPE keyType;
  SymmetricKey symKey;
  ByteString kcv;
  ByteString value;
  CK_OBJECT_CLASS objClass;
  ByteString key;
  CK_ATTRIBUTE keyAttribs [32];
  CK_BBOOL local_4b9;
  SoftHSM *local_4b8;
  uint local_4ac;
  CK_OBJECT_HANDLE *local_4a8;
  Token *local_4a0;
  undefined8 local_498;
  undefined1 local_490 [160];
  SymmetricKey local_3f0;
  ByteString local_3b8;
  ByteString local_390;
  undefined8 local_368;
  ByteString local_360;
  _CK_ATTRIBUTE local_338;
  undefined8 local_320;
  CK_BBOOL *local_318;
  undefined8 local_310;
  undefined8 local_308;
  CK_BBOOL *local_300;
  undefined8 local_2f8;
  undefined8 local_2f0;
  undefined8 *local_2e8;
  undefined8 local_2e0;
  
  *phKey = 0;
  CVar13 = hSession;
  local_4b9 = isOnToken;
  this_00 = (Session *)HandleManager::getSession(this->handleManager,hSession);
  if (this_00 == (Session *)0x0) {
    return 0xb3;
  }
  local_4a0 = Session::getToken(this_00);
  if (local_4a0 == (Token *)0x0) {
    return 5;
  }
  local_4b8 = this;
  if (ulCount == 0) {
LAB_0013af00:
    softHSMLog(6,"generateGeneric",
               "/workspace/llm4binary/github/license_c_cmakelists/opendnssec[P]SoftHSMv2/src/lib/SoftHSM.cpp"
               ,0x1d8a,"Missing CKA_VALUE_LEN in pTemplate");
    return 0xd0;
  }
  puVar7 = &pTemplate->ulValueLen;
  uVar14 = CONCAT71((int7)(CVar13 >> 8),1);
  inBitLen = 0;
  CVar12 = ulCount;
  do {
    if (((_CK_ATTRIBUTE *)(puVar7 + -2))->type == 0x90) {
      if (*puVar7 != 0) {
        format = "CKA_CHECK_VALUE must be a no-value (0 length) entry";
        iVar6 = 0x1d7d;
        goto LAB_0013af6e;
      }
      uVar14 = 0;
    }
    else if (((_CK_ATTRIBUTE *)(puVar7 + -2))->type == 0x161) {
      if (*puVar7 != 8) {
        format = "CKA_VALUE_LEN does not have the size of CK_ULONG";
        iVar6 = 0x1d75;
        goto LAB_0013af6e;
      }
      inBitLen = *(ulong *)puVar7[-1];
    }
    puVar7 = puVar7 + 3;
    CVar12 = CVar12 - 1;
  } while (CVar12 != 0);
  if (inBitLen == 0) goto LAB_0013af00;
  if (0x8000000 < inBitLen) {
    format = "bad generic key length";
    iVar6 = 0x1d91;
LAB_0013af6e:
    softHSMLog(6,"generateGeneric",
               "/workspace/llm4binary/github/license_c_cmakelists/opendnssec[P]SoftHSMv2/src/lib/SoftHSM.cpp"
               ,iVar6,format);
    return 0x13;
  }
  local_4ac = (uint)uVar14;
  local_4a8 = phKey;
  pCVar8 = CryptoFactory::i();
  iVar6 = (*pCVar8->_vptr_CryptoFactory[8])(pCVar8,1);
  plVar10 = (long *)CONCAT44(extraout_var,iVar6);
  if (plVar10 == (long *)0x0) {
    return 5;
  }
  ByteString::ByteString(&local_360);
  cVar4 = (**(code **)(*plVar10 + 0x10))(plVar10,&local_360,inBitLen);
  CVar16 = 5;
  if (cVar4 == '\0') goto LAB_0013b12a;
  local_368 = 4;
  local_498 = 0x10;
  memset(&local_338,0,0x300);
  pCVar15 = local_4a8;
  local_338.ulValueLen = 8;
  local_320 = 1;
  local_318 = &local_4b9;
  local_310 = 1;
  local_308 = 2;
  local_300 = &isPrivate;
  local_2f8 = 1;
  local_2f0 = 0x100;
  local_2e8 = &local_498;
  local_2e0 = 8;
  CVar16 = 0xd1;
  local_338.pValue = &local_368;
  if (ulCount < 0x1d) {
    uVar9 = 1;
    CVar12 = 4;
    do {
      uVar1 = pTemplate->type;
      ulCount_00 = CVar12;
      if (((2 < uVar1) && (uVar1 != 0x90)) && (uVar1 != 0x100)) {
        ulCount_00 = CVar12 + 1;
        (&local_338)[CVar12].ulValueLen = pTemplate->ulValueLen;
        pvVar2 = pTemplate->pValue;
        (&local_338)[CVar12].type = pTemplate->type;
        (&local_338)[CVar12].pValue = pvVar2;
      }
      if (0x1c < ulCount) break;
      pTemplate = pTemplate + 1;
      bVar17 = uVar9 < ulCount;
      uVar9 = uVar9 + 1;
      CVar12 = ulCount_00;
    } while (bVar17);
    CVar16 = CreateObject(local_4b8,hSession,&local_338,ulCount_00,local_4a8,4);
    if (CVar16 == 0) {
      plVar10 = (long *)HandleManager::getObject(local_4b8->handleManager,*pCVar15);
      CVar16 = 6;
      if (((plVar10 != (long *)0x0) &&
          (cVar4 = (**(code **)(*plVar10 + 0x50))(plVar10), cVar4 != '\0')) &&
         (cVar4 = (**(code **)(*plVar10 + 0x58))(plVar10,1), cVar4 != '\0')) {
        OSAttribute::OSAttribute((OSAttribute *)local_490,true);
        cVar4 = (**(code **)(*plVar10 + 0x40))(plVar10,0x163,local_490);
        OSAttribute::~OSAttribute((OSAttribute *)local_490);
        if (cVar4 == '\0') {
          cVar4 = '\0';
        }
        else {
          OSAttribute::OSAttribute((OSAttribute *)local_490,0x350);
          cVar4 = (**(code **)(*plVar10 + 0x40))(plVar10,0x166,local_490);
          OSAttribute::~OSAttribute((OSAttribute *)local_490);
        }
        bVar17 = (bool)(**(code **)(*plVar10 + 0x20))(plVar10,0x103,0);
        if (cVar4 == '\0') {
          cVar4 = '\0';
        }
        else {
          OSAttribute::OSAttribute((OSAttribute *)local_490,bVar17);
          cVar4 = (**(code **)(*plVar10 + 0x40))(plVar10,0x165,local_490);
          OSAttribute::~OSAttribute((OSAttribute *)local_490);
        }
        bVar5 = (**(code **)(*plVar10 + 0x20))(plVar10,0x162,0);
        if (cVar4 == '\0') {
          cVar4 = '\0';
        }
        else {
          OSAttribute::OSAttribute((OSAttribute *)local_490,(bool)(bVar5 ^ 1));
          cVar4 = (**(code **)(*plVar10 + 0x40))(plVar10,0x164,local_490);
          OSAttribute::~OSAttribute((OSAttribute *)local_490);
        }
        ByteString::ByteString(&local_390);
        ByteString::ByteString(&local_3b8);
        SymmetricKey::SymmetricKey(&local_3f0,0);
        SymmetricKey::setKeyBits(&local_3f0,&local_360);
        SymmetricKey::setBitLen(&local_3f0,inBitLen);
        if (isPrivate == '\0') {
          pBVar11 = SymmetricKey::getKeyBits(&local_3f0);
          ByteString::operator=(&local_390,pBVar11);
          SymmetricKey::getKeyCheckValue((ByteString *)local_490,&local_3f0);
          ByteString::operator=(&local_3b8,(ByteString *)local_490);
        }
        else {
          pBVar11 = SymmetricKey::getKeyBits(&local_3f0);
          Token::encrypt(local_4a0,(char *)pBVar11,(int)&local_390);
          SymmetricKey::getKeyCheckValue((ByteString *)local_490,&local_3f0);
          Token::encrypt(local_4a0,local_490,(int)&local_3b8);
        }
        local_490._0_8_ = &PTR__ByteString_0019d880;
        std::_Vector_base<unsigned_char,_SecureAllocator<unsigned_char>_>::~_Vector_base
                  ((_Vector_base<unsigned_char,_SecureAllocator<unsigned_char>_> *)(local_490 + 8));
        if (cVar4 == '\0') {
LAB_0013b40f:
          (**(code **)(*plVar10 + 0x68))(plVar10);
          cVar4 = '\0';
        }
        else {
          OSAttribute::OSAttribute((OSAttribute *)local_490,&local_390);
          cVar4 = (**(code **)(*plVar10 + 0x40))(plVar10,0x11,local_490);
          OSAttribute::~OSAttribute((OSAttribute *)local_490);
          if ((local_4ac & 1) != 0) {
            if (cVar4 == '\0') goto LAB_0013b40f;
            OSAttribute::OSAttribute((OSAttribute *)local_490,&local_3b8);
            cVar4 = (**(code **)(*plVar10 + 0x40))(plVar10,0x90,local_490);
            OSAttribute::~OSAttribute((OSAttribute *)local_490);
          }
          if (cVar4 == '\0') goto LAB_0013b40f;
          cVar4 = (**(code **)(*plVar10 + 0x60))(plVar10);
        }
        local_3f0.super_Serialisable._vptr_Serialisable = (_func_int **)&PTR_serialise_0019bdb8;
        local_3f0.keyData._vptr_ByteString = (_func_int **)&PTR__ByteString_0019d880;
        std::_Vector_base<unsigned_char,_SecureAllocator<unsigned_char>_>::~_Vector_base
                  (&local_3f0.keyData.byteString.
                    super__Vector_base<unsigned_char,_SecureAllocator<unsigned_char>_>);
        local_3b8._vptr_ByteString = (_func_int **)&PTR__ByteString_0019d880;
        std::_Vector_base<unsigned_char,_SecureAllocator<unsigned_char>_>::~_Vector_base
                  (&local_3b8.byteString.
                    super__Vector_base<unsigned_char,_SecureAllocator<unsigned_char>_>);
        local_390._vptr_ByteString = (_func_int **)&PTR__ByteString_0019d880;
        std::_Vector_base<unsigned_char,_SecureAllocator<unsigned_char>_>::~_Vector_base
                  (&local_390.byteString.
                    super__Vector_base<unsigned_char,_SecureAllocator<unsigned_char>_>);
        pCVar15 = local_4a8;
        if (cVar4 != '\0') {
          CVar16 = 0;
          goto LAB_0013b12a;
        }
      }
    }
  }
  pSVar3 = local_4b8;
  if (*pCVar15 != 0) {
    plVar10 = (long *)HandleManager::getObject(local_4b8->handleManager,*pCVar15);
    HandleManager::destroyObject(pSVar3->handleManager,*pCVar15);
    if (plVar10 != (long *)0x0) {
      (**(code **)(*plVar10 + 0x70))(plVar10);
    }
    *pCVar15 = 0;
  }
LAB_0013b12a:
  local_360._vptr_ByteString = (_func_int **)&PTR__ByteString_0019d880;
  std::_Vector_base<unsigned_char,_SecureAllocator<unsigned_char>_>::~_Vector_base
            (&local_360.byteString.
              super__Vector_base<unsigned_char,_SecureAllocator<unsigned_char>_>);
  return CVar16;
}

Assistant:

CK_RV SoftHSM::generateGeneric
(CK_SESSION_HANDLE hSession,
	CK_ATTRIBUTE_PTR pTemplate,
	CK_ULONG ulCount,
	CK_OBJECT_HANDLE_PTR phKey,
	CK_BBOOL isOnToken,
	CK_BBOOL isPrivate)
{
	*phKey = CK_INVALID_HANDLE;

	// Get the session
	Session* session = (Session*)handleManager->getSession(hSession);
	if (session == NULL)
		return CKR_SESSION_HANDLE_INVALID;

	// Get the token
	Token* token = session->getToken();
	if (token == NULL)
		return CKR_GENERAL_ERROR;

	// Extract desired parameter information
	size_t keyLen = 0;
	bool checkValue = true;
	for (CK_ULONG i = 0; i < ulCount; i++)
	{
		switch (pTemplate[i].type)
		{
			case CKA_VALUE_LEN:
				if (pTemplate[i].ulValueLen != sizeof(CK_ULONG))
				{
					INFO_MSG("CKA_VALUE_LEN does not have the size of CK_ULONG");
					return CKR_ATTRIBUTE_VALUE_INVALID;
				}
				keyLen = *(CK_ULONG*)pTemplate[i].pValue;
				break;
			case CKA_CHECK_VALUE:
				if (pTemplate[i].ulValueLen > 0)
				{
					INFO_MSG("CKA_CHECK_VALUE must be a no-value (0 length) entry");
					return CKR_ATTRIBUTE_VALUE_INVALID;
				}
				checkValue = false;
				break;
			default:
				break;
		}
	}

	// CKA_VALUE_LEN must be specified
	if (keyLen == 0)
	{
		INFO_MSG("Missing CKA_VALUE_LEN in pTemplate");
		return CKR_TEMPLATE_INCOMPLETE;
	}

	// Check keyLen
	if (keyLen < 1 || keyLen > 0x8000000)
	{
		INFO_MSG("bad generic key length");
		return CKR_ATTRIBUTE_VALUE_INVALID;
	}

	// Generate the secret key
	RNG* rng = CryptoFactory::i()->getRNG();
	if (rng == NULL) return CKR_GENERAL_ERROR;
	ByteString key;
	if (!rng->generateRandom(key, keyLen)) return CKR_GENERAL_ERROR;

        CK_RV rv = CKR_OK;

	// Create the secret key object using C_CreateObject
	const CK_ULONG maxAttribs = 32;
	CK_OBJECT_CLASS objClass = CKO_SECRET_KEY;
	CK_KEY_TYPE keyType = CKK_GENERIC_SECRET;
	CK_ATTRIBUTE keyAttribs[maxAttribs] = {
		{ CKA_CLASS, &objClass, sizeof(objClass) },
		{ CKA_TOKEN, &isOnToken, sizeof(isOnToken) },
		{ CKA_PRIVATE, &isPrivate, sizeof(isPrivate) },
		{ CKA_KEY_TYPE, &keyType, sizeof(keyType) },
	};
	CK_ULONG keyAttribsCount = 4;

	// Add the additional
	if (ulCount > (maxAttribs - keyAttribsCount))
		rv = CKR_TEMPLATE_INCONSISTENT;
	for (CK_ULONG i=0; i < ulCount && rv == CKR_OK; ++i)
	{
		switch (pTemplate[i].type)
		{
			case CKA_CLASS:
			case CKA_TOKEN:
			case CKA_PRIVATE:
			case CKA_KEY_TYPE:
			case CKA_CHECK_VALUE:
				continue;
			default:
				keyAttribs[keyAttribsCount++] = pTemplate[i];
				break;
		}
	}

	if (rv == CKR_OK)
		rv = CreateObject(hSession, keyAttribs, keyAttribsCount, phKey, OBJECT_OP_GENERATE);

	// Store the attributes that are being supplied
	if (rv == CKR_OK)
	{
		OSObject* osobject = (OSObject*)handleManager->getObject(*phKey);
		if (osobject == NULL_PTR || !osobject->isValid()) {
			rv = CKR_FUNCTION_FAILED;
		} else if (osobject->startTransaction()) {
			bool bOK = true;

			// Common Attributes
			bOK = bOK && osobject->setAttribute(CKA_LOCAL,true);
			CK_ULONG ulKeyGenMechanism = (CK_ULONG)CKM_GENERIC_SECRET_KEY_GEN;
			bOK = bOK && osobject->setAttribute(CKA_KEY_GEN_MECHANISM,ulKeyGenMechanism);

			// Common Secret Key Attributes
			bool bAlwaysSensitive = osobject->getBooleanValue(CKA_SENSITIVE, false);
			bOK = bOK && osobject->setAttribute(CKA_ALWAYS_SENSITIVE,bAlwaysSensitive);
			bool bNeverExtractable = osobject->getBooleanValue(CKA_EXTRACTABLE, false) == false;
			bOK = bOK && osobject->setAttribute(CKA_NEVER_EXTRACTABLE, bNeverExtractable);

			// Generic Secret Key Attributes
			ByteString value;
			ByteString kcv;
			SymmetricKey symKey;
			symKey.setKeyBits(key);
			symKey.setBitLen(keyLen);
			if (isPrivate)
			{
				token->encrypt(symKey.getKeyBits(), value);
				token->encrypt(symKey.getKeyCheckValue(), kcv);
			}
			else
			{
				value = symKey.getKeyBits();
				kcv = symKey.getKeyCheckValue();
			}
			bOK = bOK && osobject->setAttribute(CKA_VALUE, value);
			if (checkValue)
				bOK = bOK && osobject->setAttribute(CKA_CHECK_VALUE, kcv);

			if (bOK)
				bOK = osobject->commitTransaction();
			else
				osobject->abortTransaction();

			if (!bOK)
				rv = CKR_FUNCTION_FAILED;
		} else
			rv = CKR_FUNCTION_FAILED;
	}

	// Clean up
	// Remove the key that may have been created already when the function fails.
	if (rv != CKR_OK)
	{
		if (*phKey != CK_INVALID_HANDLE)
		{
			OSObject* oskey = (OSObject*)handleManager->getObject(*phKey);
			handleManager->destroyObject(*phKey);
			if (oskey) oskey->destroyObject();
			*phKey = CK_INVALID_HANDLE;
		}
	}

	return rv;
}